

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

bool __thiscall
slang::ast::TimingControl::visit<slang::ast::ConstraintExprVisitor>
          (TimingControl *this,ConstraintExprVisitor *visitor)

{
  logic_error *this_00;
  string local_f8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ConstraintExprVisitor *local_20;
  ConstraintExprVisitor *visitor_local;
  TimingControl *this_local;
  
  local_20 = visitor;
  visitor_local = (ConstraintExprVisitor *)this;
  switch(this->kind) {
  case Invalid:
    this_local._7_1_ = ConstraintExprVisitor::visit<slang::ast::TimingControl>(visitor,this);
    break;
  case Delay:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::DelayControl>(visitor,(DelayControl *)this);
    break;
  case SignalEvent:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::SignalEventControl>
                   (visitor,(SignalEventControl *)this);
    break;
  case EventList:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::EventListControl>
                   (visitor,(EventListControl *)this);
    break;
  case ImplicitEvent:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::ImplicitEventControl>
                   (visitor,(ImplicitEventControl *)this);
    break;
  case RepeatedEvent:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::RepeatedEventControl>
                   (visitor,(RepeatedEventControl *)this);
    break;
  case Delay3:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::Delay3Control>(visitor,(Delay3Control *)this);
    break;
  case OneStepDelay:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::OneStepDelayControl>
                   (visitor,(OneStepDelayControl *)this);
    break;
  case CycleDelay:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::CycleDelayControl>
                   (visitor,(CycleDelayControl *)this);
    break;
  case BlockEventList:
    this_local._7_1_ =
         ConstraintExprVisitor::visit<slang::ast::BlockEventListControl>
                   (visitor,(BlockEventListControl *)this);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_c1);
    std::operator+(&local_a0,&local_c0,":");
    std::__cxx11::to_string(&local_f8,0x123);
    std::operator+(&local_80,&local_a0,&local_f8);
    std::operator+(&local_60,&local_80,": ");
    std::operator+(&local_40,&local_60,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return this_local._7_1_;
}

Assistant:

decltype(auto) TimingControl::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case TimingControlKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case TimingControlKind::Invalid: return visitor.visit(*this, std::forward<Args>(args)...);
        CASE(Delay, DelayControl);
        CASE(Delay3, Delay3Control);
        CASE(SignalEvent, SignalEventControl);
        CASE(EventList, EventListControl);
        CASE(ImplicitEvent, ImplicitEventControl);
        CASE(RepeatedEvent, RepeatedEventControl);
        CASE(OneStepDelay, OneStepDelayControl);
        CASE(CycleDelay, CycleDelayControl);
        CASE(BlockEventList, BlockEventListControl);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}